

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDom.cc
# Opt level: O2

Entity __thiscall avro::json::loadEntity(json *this,InputStream *in)

{
  any extraout_RDX;
  Entity EVar1;
  JsonParser p;
  JsonParser JStack_b8;
  
  JsonParser::JsonParser(&JStack_b8);
  StreamReader::reset(&JStack_b8.in_,in);
  readEntity(this,&JStack_b8);
  JsonParser::~JsonParser(&JStack_b8);
  EVar1.value_.content = extraout_RDX.content;
  EVar1._0_8_ = this;
  return EVar1;
}

Assistant:

Entity loadEntity(InputStream& in)
{
    JsonParser p;
    p.init(in);
    return readEntity(p);
}